

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# despot.cpp
# Opt level: O2

ValuedAction __thiscall despot::DESPOT::Search(DESPOT *this)

{
  SearchStatistics *statistics;
  DSPOMDP *pDVar1;
  Belief *pBVar2;
  int iVar3;
  log_ostream *plVar4;
  ostream *poVar5;
  VNode *pVVar6;
  long lVar7;
  SearchStatistics *pSVar8;
  SearchStatistics *pSVar9;
  byte bVar10;
  double dVar11;
  double dVar12;
  ValuedAction VVar13;
  vector<despot::State_*,_std::allocator<despot::State_*>_> particles;
  ValuedAction local_a0;
  SearchStatistics local_90;
  
  bVar10 = 0;
  iVar3 = logging::level();
  if (3 < iVar3) {
    pDVar1 = (this->super_Solver).model_;
    (*pDVar1->_vptr_DSPOMDP[0x14])(pDVar1,(this->super_Solver).belief_,&std::cout);
  }
  if (Globals::config <= 0.0) {
    iVar3 = (*((this->super_Solver).model_)->_vptr_DSPOMDP[5])();
    iVar3 = Random::NextInt((Random *)&Random::RANDOM,iVar3);
    ValuedAction::ValuedAction(&local_a0,iVar3,-INFINITY);
    goto LAB_00171582;
  }
  dVar11 = get_time_second();
  pBVar2 = (this->super_Solver).belief_;
  (*pBVar2->_vptr_Belief[2])(&particles,pBVar2,(ulong)(uint)DAT_0019fdcc);
  iVar3 = logging::level();
  if (0 < iVar3) {
    iVar3 = logging::level();
    if (2 < iVar3) {
      plVar4 = logging::stream(3);
      poVar5 = std::operator<<(&plVar4->super_ostream,"[DESPOT::Search] Time for sampling ");
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      std::operator<<(poVar5," particles: ");
      dVar12 = get_time_second();
      poVar5 = std::ostream::_M_insert<double>(dVar12 - dVar11);
      poVar5 = std::operator<<(poVar5,"s");
      std::endl<char,std::char_traits<char>>(poVar5);
    }
  }
  SearchStatistics::SearchStatistics(&local_90);
  statistics = &this->statistics_;
  pSVar8 = &local_90;
  pSVar9 = statistics;
  for (lVar7 = 0xc; lVar7 != 0; lVar7 = lVar7 + -1) {
    pSVar9->initial_lb = pSVar8->initial_lb;
    pSVar8 = (SearchStatistics *)((long)pSVar8 + ((ulong)bVar10 * -2 + 1) * 8);
    pSVar9 = (SearchStatistics *)((long)pSVar9 + (ulong)bVar10 * -0x10 + 8);
  }
  dVar11 = get_time_second();
  if (Search()::streams == '\0') {
    iVar3 = __cxa_guard_acquire(&Search()::streams);
    if (iVar3 != 0) {
      RandomStreams::RandomStreams(&Search::streams,DAT_0019fdcc,DAT_0019fdd0);
      __cxa_atexit(RandomStreams::~RandomStreams,&Search::streams,&__dso_handle);
      __cxa_guard_release(&Search()::streams);
    }
  }
  if (this->upper_bound_ == (ScenarioUpperBound *)0x0) {
LAB_00171337:
    RandomStreams::RandomStreams((RandomStreams *)&local_90,DAT_0019fdcc,DAT_0019fdd0);
    RandomStreams::operator=(&Search::streams,(RandomStreams *)&local_90);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)&local_90);
    (*this->lower_bound_->_vptr_ScenarioLowerBound[2])(this->lower_bound_,&Search::streams);
    (*this->upper_bound_->_vptr_ScenarioUpperBound[2])(this->upper_bound_,&Search::streams);
  }
  else {
    lVar7 = __dynamic_cast(this->upper_bound_,&ScenarioUpperBound::typeinfo,
                           &LookaheadUpperBound::typeinfo,0);
    if (lVar7 == 0) goto LAB_00171337;
    if (Search()::initialized == '\0') {
      (*this->lower_bound_->_vptr_ScenarioLowerBound[2])(this->lower_bound_,&Search::streams);
      (*this->upper_bound_->_vptr_ScenarioUpperBound[2])(this->upper_bound_,&Search::streams);
      Search()::initialized = '\x01';
    }
  }
  pVVar6 = ConstructTree(&particles,&Search::streams,this->lower_bound_,this->upper_bound_,
                         (this->super_Solver).model_,&(this->super_Solver).history_,Globals::config,
                         statistics);
  this->root_ = pVVar6;
  iVar3 = logging::level();
  if (0 < iVar3) {
    iVar3 = logging::level();
    if (2 < iVar3) {
      plVar4 = logging::stream(3);
      std::operator<<(&plVar4->super_ostream,"[DESPOT::Search] Time for tree construction: ");
      dVar12 = get_time_second();
      poVar5 = std::ostream::_M_insert<double>(dVar12 - dVar11);
      poVar5 = std::operator<<(poVar5,"s");
      std::endl<char,std::char_traits<char>>(poVar5);
    }
  }
  dVar11 = get_time_second();
  VNode::Free(this->root_,(this->super_Solver).model_);
  iVar3 = logging::level();
  if (0 < iVar3) {
    iVar3 = logging::level();
    if (2 < iVar3) {
      plVar4 = logging::stream(3);
      std::operator<<(&plVar4->super_ostream,
                      "[DESPOT::Search] Time for freeing particles in search tree: ");
      dVar12 = get_time_second();
      poVar5 = std::ostream::_M_insert<double>(dVar12 - dVar11);
      poVar5 = std::operator<<(poVar5,"s");
      std::endl<char,std::char_traits<char>>(poVar5);
    }
  }
  VVar13 = OptimalAction(this->root_);
  dVar11 = get_time_second();
  pVVar6 = this->root_;
  if (pVVar6 != (VNode *)0x0) {
    VNode::~VNode(pVVar6);
  }
  operator_delete(pVVar6,0x98);
  iVar3 = logging::level();
  if (0 < iVar3) {
    iVar3 = logging::level();
    if (2 < iVar3) {
      plVar4 = logging::stream(3);
      std::operator<<(&plVar4->super_ostream,"[DESPOT::Search] Time for deleting tree: ");
      dVar12 = get_time_second();
      poVar5 = std::ostream::_M_insert<double>(dVar12 - dVar11);
      poVar5 = std::operator<<(poVar5,"s");
      std::endl<char,std::char_traits<char>>(poVar5);
    }
  }
  iVar3 = logging::level();
  if (0 < iVar3) {
    iVar3 = logging::level();
    if (2 < iVar3) {
      plVar4 = logging::stream(3);
      poVar5 = std::operator<<(&plVar4->super_ostream,"[DESPOT::Search] Search statistics:");
      poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
      poVar5 = despot::operator<<(poVar5,statistics);
      std::endl<char,std::char_traits<char>>(poVar5);
    }
  }
  std::_Vector_base<despot::State_*,_std::allocator<despot::State_*>_>::~_Vector_base
            (&particles.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>);
  local_a0.value = VVar13.value;
  local_a0.action = VVar13.action;
LAB_00171582:
  VVar13._4_4_ = 0;
  VVar13.action = local_a0.action;
  VVar13.value = local_a0.value;
  return VVar13;
}

Assistant:

ValuedAction DESPOT::Search() {
	if (logging::level() >= logging::DEBUG) {
		model_->PrintBelief(*belief_);
	}

	if (Globals::config.time_per_move <= 0) // Return a random action if no time is allocated for planning
		return ValuedAction(Random::RANDOM.NextInt(model_->NumActions()),
			Globals::NEG_INFTY);

	double start = get_time_second();
	vector<State*> particles = belief_->Sample(Globals::config.num_scenarios);
	logi << "[DESPOT::Search] Time for sampling " << particles.size()
		<< " particles: " << (get_time_second() - start) << "s" << endl;

	statistics_ = SearchStatistics();

	start = get_time_second();
	static RandomStreams streams = RandomStreams(Globals::config.num_scenarios,
		Globals::config.search_depth);

	LookaheadUpperBound* ub = dynamic_cast<LookaheadUpperBound*>(upper_bound_);
	if (ub != NULL) { // Avoid using new streams for LookaheadUpperBound
		static bool initialized = false;
		if (!initialized ) {
			lower_bound_->Init(streams);
			upper_bound_->Init(streams);
			initialized = true;
		}
	} else {
		streams = RandomStreams(Globals::config.num_scenarios,
			Globals::config.search_depth);
		lower_bound_->Init(streams);
		upper_bound_->Init(streams);
	}

	root_ = ConstructTree(particles, streams, lower_bound_, upper_bound_,
		model_, history_, Globals::config.time_per_move, &statistics_);
	logi << "[DESPOT::Search] Time for tree construction: "
		<< (get_time_second() - start) << "s" << endl;

	start = get_time_second();
	root_->Free(*model_);
	logi << "[DESPOT::Search] Time for freeing particles in search tree: "
		<< (get_time_second() - start) << "s" << endl;

	ValuedAction astar = OptimalAction(root_);
	start = get_time_second();
	delete root_;

	logi << "[DESPOT::Search] Time for deleting tree: "
		<< (get_time_second() - start) << "s" << endl;
	logi << "[DESPOT::Search] Search statistics:" << endl << statistics_
		<< endl;

	return astar;
}